

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_hardenfist(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  CHAR_DATA *in_RDX;
  int in_ESI;
  int in_EDI;
  AFFECT_DATA af;
  void *in_stack_ffffffffffffff78;
  void *arg1;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 uVar4;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  undefined2 in_stack_ffffffffffffff9e;
  CHAR_DATA *in_stack_ffffffffffffffa0;
  
  bVar1 = is_affected(in_RDX,in_EDI);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  else {
    init_affect((AFFECT_DATA *)0x6dc715);
    uVar4 = 0;
    uVar2 = (undefined2)in_EDI;
    uVar3 = (undefined2)in_ESI;
    arg1 = (void *)0x0;
    new_affect_to_char(in_stack_ffffffffffffffa0,
                       (AFFECT_DATA *)
                       CONCAT26(in_stack_ffffffffffffff9e,(uint6)(in_ESI / 3 & 0xffff)));
    act((char *)CONCAT26(uVar3,CONCAT24(uVar2,CONCAT22(uVar4,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,arg1,in_stack_ffffffffffffff78,0);
    act((char *)CONCAT26(uVar3,CONCAT24(uVar2,CONCAT22(uVar4,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,arg1,in_stack_ffffffffffffff78,0);
  }
  return;
}

Assistant:

void spell_hardenfist(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (!is_affected(ch, sn))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = sn;
		af.aftype = AFT_SPELL;
		af.level = level;
		af.duration = level / 3;
		af.location = 0;
		af.modifier = 0;
		af.owner = nullptr;
		af.end_fun = nullptr;
		new_affect_to_char(ch, &af);

		act("$n clenches $s fists tightly as the flesh seems to take on a stony pallor.", ch, 0, 0, TO_ROOM);
		act("As you clench your fist, it becomes as hard as granite.", ch, 0, 0, TO_CHAR);
	}
	else
	{
		send_to_char("Your fists are already as hard as granite.\n\r", ch);
	}
}